

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
convolute(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Settings *s,
         Data *d,vector<unsigned_int,_std::allocator<unsigned_int>_> *kernel)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer __s;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  Data *pDVar7;
  long lVar8;
  uint uVar9;
  size_type __n;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  string pstr;
  double local_140;
  double local_130;
  long *local_128;
  long local_120;
  long local_118 [2];
  string local_108;
  double local_e8;
  double local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  double local_d0;
  string local_c8;
  double local_a8;
  Data *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  string local_70;
  string local_50;
  
  __n = (long)s->ny * (long)s->nx;
  s->nxy = (int)__n;
  local_d8 = kernel;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_128);
  __s = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__s != puVar4) {
    memset(__s,0,((long)puVar4 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"=","");
  if (s->sampling == pointwise) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Convoluting pointwise...",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_128,local_120 + (long)local_128);
    printBar(0x46,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar12 = (ulong)(uint)d->ntrkptsum;
    if (0 < d->ntrkptsum) {
      iVar11 = 0;
      lVar8 = 0;
      do {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_128,local_120 + (long)local_128);
        printProgress(iVar11 / (int)uVar12,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        addKernel(s,(d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8],
                  (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8],__return_storage_ptr__,local_d8,1.0);
        lVar8 = lVar8 + 1;
        uVar12 = (ulong)d->ntrkptsum;
        iVar11 = iVar11 + 0x46;
      } while (lVar8 < (long)uVar12);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Convoluting linearly...",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_128,local_120 + (long)local_128);
    printBar(0x46,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iVar11 = d->ntrkptsum;
    if (0 < iVar11) {
      uVar9 = 0;
      local_d0 = 1.0;
      local_140 = 0.0;
      uVar12 = 0;
      dVar13 = 0.0;
      local_a0 = d;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_e8 = dVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,local_128,local_120 + (long)local_128);
        uVar10 = (uint)uVar12;
        printProgress((int)(uVar10 * 0x46) / iVar11,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        pDVar7 = local_a0;
        if (uVar10 == (local_a0->iEndSeg).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]) {
          uVar9 = uVar9 + 1;
          uVar12 = (ulong)(uVar10 + 1);
          dVar14 = 0.0;
        }
        else {
          if (s->mapType != heat) {
            pdVar5 = (local_a0->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_e0 = pdVar5[(int)uVar10];
            local_a8 = pdVar5[(long)(int)uVar10 + 1];
          }
          pdVar5 = (local_a0->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (local_a0->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_78 = pdVar6[(int)uVar10];
          local_88 = pdVar5[(int)uVar10];
          local_80 = pdVar6[(long)(int)uVar10 + 1] - local_78;
          local_90 = pdVar5[(long)(int)uVar10 + 1] - local_88;
          dVar13 = local_90 * local_90 + local_80 * local_80;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          local_130 = dVar13 / s->degPerPix;
          dVar14 = local_e8;
          if (local_e8 < 1.0) {
            local_98 = local_a8 - local_e0;
            do {
              local_140 = dVar14;
              if (s->mapType != heat) {
                local_d0 = (((local_140 * local_98 + local_e0) - s->mins) * 1000000000.0) /
                           (s->maxs - s->mins);
              }
              addKernel(s,local_140 * local_90 + local_88,local_140 * local_80 + local_78,
                        __return_storage_ptr__,local_d8,local_d0);
              if ((local_130 != 0.0) || (NAN(local_130))) {
                dVar14 = ((double)s->r * s->step) / local_130 + local_140;
              }
              else {
                uVar12 = (ulong)((int)uVar12 + 1);
                dVar14 = local_140;
              }
            } while (((local_130 != 0.0) || (NAN(local_130))) && (dVar14 < 1.0));
          }
        }
        if (((local_130 != 0.0) || (NAN(local_130))) && (1.0 <= dVar14)) {
          uVar12 = (ulong)(int)uVar12;
          dVar13 = local_130;
          do {
            local_130 = dVar13;
            if (((pDVar7->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9] <= (uint)uVar12) ||
               ((long)pDVar7->ntrkptsum <= (long)uVar12)) break;
            pdVar5 = (pDVar7->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (pDVar7->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar15 = pdVar6[uVar12 + 1];
            dVar1 = pdVar6[uVar12 + 2];
            dVar2 = pdVar5[uVar12 + 1];
            dVar3 = pdVar5[uVar12 + 2];
            if ((dVar15 != dVar1) || (NAN(dVar15) || NAN(dVar1))) {
LAB_0010e6fe:
              dVar14 = (dVar3 - dVar2) * (dVar3 - dVar2) + (dVar1 - dVar15) * (dVar1 - dVar15);
              if (dVar14 < 0.0) {
                dVar14 = sqrt(dVar14);
              }
              else {
                dVar14 = SQRT(dVar14);
              }
              local_130 = dVar14 / s->degPerPix;
              dVar15 = (double)s->r * s->step;
              dVar14 = (dVar15 - dVar13 * (1.0 - local_140)) / local_130;
              local_140 = dVar14 - dVar15 / local_130;
            }
            else if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) goto LAB_0010e6fe;
            uVar12 = uVar12 + 1;
            dVar13 = local_130;
          } while (1.0 <= dVar14);
        }
        dVar13 = 0.0;
        if (0.0 <= dVar14) {
          dVar13 = dVar14;
        }
        iVar11 = pDVar7->ntrkptsum;
      } while ((int)uVar12 < iVar11);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> convolute(Settings& s, Data& d,
		std::vector<unsigned int>& kernel)
{
	s.nxy = s.nx * s.ny;
	std::vector<unsigned int> img(s.nxy);

	// Initialize
	std::fill(img.begin(), img.end(), 0);

	// Number of characters in progress bar
	int np = 70;
	const std::string pstr = "=";

	// Kernel scalar for map types other than heat
	double scalar = 1.0;
	double scaleMax = 1.e9;

	if (s.sampling == pointwise)
	{
		std::cout << "Convoluting pointwise..." << std::endl;
		printBar(np, pstr);
		for (int i = 0; i < d.ntrkptsum; i++)
		{
			printProgress(np * i / d.ntrkptsum, pstr);
			addKernel(s, d.lats[i], d.lons[i], img, kernel, scalar);
		}
	}
	else
	{
		std::cout << "Convoluting linearly..." << std::endl;
		printBar(np, pstr);
		unsigned int iseg = 0;
		double dd = 0.0;
		double dd0 = 0.0;

		int i = 0;
		while (i < d.ntrkptsum)
		{
			double dpix;
			printProgress(np * i / d.ntrkptsum, pstr);
			if (i == d.iEndSeg[iseg])
			{
				// Final point
				iseg++;
				i++;
				dd = 0.0;
			}
			else
			{
				//std::cout << "sampling dd = " << dd << std::endl;

				// Linear subsampling

				double x0 = d.lons[i];
				double y0 = d.lats[i];
				double x1 = d.lons[i + 1];
				double y1 = d.lats[i + 1];

				double s0, s1;
				if (s.mapType != heat)
				{
					s0 = d.scas[i];
					s1 = d.scas[i + 1];
				}

				// Distance between trackpoint i and i+1 in units of
				// pixels.  Already calculated?
				dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

				while (dd < 1.0)
				{
					//std::cout << "dd = " << dd << std::endl;

					double lat = y0 + dd * (y1 - y0);
					double lon = x0 + dd * (x1 - x0);

					if (s.mapType != heat)
					{
						double sca = s0 + dd * (s1 - s0);
						scalar = scaleMax * (sca - s.mins) / (s.maxs - s.mins);
						//std::cout << "scalar = " << scalar << "\n";
					}

					addKernel(s, lat, lon, img, kernel, scalar);

					dd0 = dd;
					if (dpix == 0.0)
					{
						i++;
						break;
					}
					else
					{
						// Move a step of a fraction of the kernel radius
						dd += s.step * s.r / dpix;
					}

				}
			}
			//std::cout << "d.iEndSeg[iseg] = " << d.iEndSeg[iseg] << "\n";

			// Offset next kernel one step size away from last one
			double dpix0 = dpix;
			if (dpix0 != 0.0)
			{
				while (dd >= 1.0 && i < d.iEndSeg[iseg] && i < d.ntrkptsum)
				{
					i++;
					//std::cout << "i = " << i << std::endl;

					double x0 = d.lons[i];
					double y0 = d.lats[i];
					double x1 = d.lons[i + 1];
					double y1 = d.lats[i + 1];

					if (x0 != x1 || y0 != y1)
					{
						dpix0 = dpix;
						dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

						// Residual distance leftover from the last
						// line, as a fraction of last line's length
						double ddres = 1.0 - dd0;

						// Residual in pixels
						double pixres = ddres * dpix0;

						// Offset from new starting point in pixels
						double pixstart = s.step * s.r - pixres;

						// Dimensionless offset (and hypothetical
						// previous point in case of overflow)
						dd = pixstart / dpix;
						dd0 = dd - s.step * s.r / dpix;

						//std::cout << "dd = " << dd << std::endl;
					}
				}
			}

			// Just in case
			dd = std::max(dd, 0.0);

		}
	}
	std::cout << "|" << std::endl;

	//std::cout << img << std::endl;
	return img;
}